

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

int __thiscall
CCollision::IntersectLine
          (CCollision *this,vec2 Pos0,vec2 Pos1,vec2 *pOutCollision,vec2 *pOutBeforeCollision)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  vector2_base<float> *in_RDX;
  vector2_base<float> *in_RSI;
  vector2_base<float> *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  vector2_base<float> in_XMM0_Qa;
  vector2_base<float> vVar6;
  vector2_base<float> in_XMM1_Qa;
  int i;
  float InverseEnd;
  int End;
  vec2 Pos;
  vec2 Last;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff98;
  float x;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_ffffffffffffffc0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_ffffffffffffffc4;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar4 = distance<float>(in_RDI,(vector2_base<float> *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  fVar4 = (float)(int)(fVar4 + 1.0);
  fVar5 = 1.0 / (float)(int)fVar4;
  x = 0.0;
  local_20 = in_XMM0_Qa;
  do {
    if ((int)fVar4 < (int)x) {
      if (in_RSI != (vector2_base<float> *)0x0) {
        *in_RSI = in_XMM1_Qa;
      }
      if (in_RDX != (vector2_base<float> *)0x0) {
        *in_RDX = in_XMM1_Qa;
      }
      iVar3 = 0;
LAB_0025a084:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    vVar6.field_1 = in_stack_ffffffffffffffc4;
    vVar6.field_0 = in_stack_ffffffffffffffc0;
    vVar6 = mix<vector2_base<float>,float>(in_XMM1_Qa,vVar6,fVar4);
    bVar2 = CheckPoint((CCollision *)CONCAT44(fVar4,fVar5),x,in_stack_ffffffffffffff98,
                       (int)((ulong)in_RDI >> 0x20));
    if (bVar2) {
      if (in_RSI != (vector2_base<float> *)0x0) {
        *in_RSI = vVar6;
      }
      if (in_RDX != (vector2_base<float> *)0x0) {
        *in_RDX = local_20;
      }
      iVar3 = GetCollisionAt((CCollision *)CONCAT44(fVar4,fVar5),x,in_stack_ffffffffffffff98);
      goto LAB_0025a084;
    }
    x = (float)((int)x + 1);
    local_20 = vVar6;
  } while( true );
}

Assistant:

int CCollision::IntersectLine(vec2 Pos0, vec2 Pos1, vec2 *pOutCollision, vec2 *pOutBeforeCollision) const
{
	const int End = distance(Pos0, Pos1)+1;
	const float InverseEnd = 1.0f/End;
	vec2 Last = Pos0;

	for(int i = 0; i <= End; i++)
	{
		vec2 Pos = mix(Pos0, Pos1, i*InverseEnd);
		if(CheckPoint(Pos.x, Pos.y))
		{
			if(pOutCollision)
				*pOutCollision = Pos;
			if(pOutBeforeCollision)
				*pOutBeforeCollision = Last;
			return GetCollisionAt(Pos.x, Pos.y);
		}
		Last = Pos;
	}
	if(pOutCollision)
		*pOutCollision = Pos1;
	if(pOutBeforeCollision)
		*pOutBeforeCollision = Pos1;
	return 0;
}